

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _PDCLIB_bigint10.c
# Opt level: O0

int main(void)

{
  int iVar1;
  undefined1 local_120 [8];
  _PDCLIB_bigint_t expected;
  _PDCLIB_bigint_t big;
  
  _PDCLIB_bigint10((_PDCLIB_bigint_t *)&expected.size,0);
  _PDCLIB_bigint32((_PDCLIB_bigint_t *)local_120,1);
  iVar1 = _PDCLIB_bigint_cmp((_PDCLIB_bigint_t *)&expected.size,(_PDCLIB_bigint_t *)local_120);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint10.c, line %d - %s\n"
           ,0x3c,"_PDCLIB_bigint_cmp( &big, &expected ) == 0");
  }
  _PDCLIB_bigint10((_PDCLIB_bigint_t *)&expected.size,1);
  _PDCLIB_bigint32((_PDCLIB_bigint_t *)local_120,10);
  iVar1 = _PDCLIB_bigint_cmp((_PDCLIB_bigint_t *)&expected.size,(_PDCLIB_bigint_t *)local_120);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint10.c, line %d - %s\n"
           ,0x40,"_PDCLIB_bigint_cmp( &big, &expected ) == 0");
  }
  _PDCLIB_bigint10((_PDCLIB_bigint_t *)&expected.size,9);
  _PDCLIB_bigint32((_PDCLIB_bigint_t *)local_120,1000000000);
  iVar1 = _PDCLIB_bigint_cmp((_PDCLIB_bigint_t *)&expected.size,(_PDCLIB_bigint_t *)local_120);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint10.c, line %d - %s\n"
           ,0x44,"_PDCLIB_bigint_cmp( &big, &expected ) == 0");
  }
  _PDCLIB_bigint10((_PDCLIB_bigint_t *)&expected.size,0x11);
  _PDCLIB_bigint64((_PDCLIB_bigint_t *)local_120,0x1634578,0x5d8a0000);
  iVar1 = _PDCLIB_bigint_cmp((_PDCLIB_bigint_t *)&expected.size,(_PDCLIB_bigint_t *)local_120);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint10.c, line %d - %s\n"
           ,0x48,"_PDCLIB_bigint_cmp( &big, &expected ) == 0");
  }
  _PDCLIB_bigint10((_PDCLIB_bigint_t *)&expected.size,0x12);
  _PDCLIB_bigint64((_PDCLIB_bigint_t *)local_120,0xde0b6b3,0xa7640000);
  iVar1 = _PDCLIB_bigint_cmp((_PDCLIB_bigint_t *)&expected.size,(_PDCLIB_bigint_t *)local_120);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint10.c, line %d - %s\n"
           ,0x4c,"_PDCLIB_bigint_cmp( &big, &expected ) == 0");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
#ifndef REGTEST
    _PDCLIB_bigint_t big, expected;
    _PDCLIB_bigint10( &big, 0 );
    _PDCLIB_bigint32( &expected, 1 );
    TESTCASE( _PDCLIB_bigint_cmp( &big, &expected ) == 0 );

    _PDCLIB_bigint10( &big, 1 );
    _PDCLIB_bigint32( &expected, 10 );
    TESTCASE( _PDCLIB_bigint_cmp( &big, &expected ) == 0 );

    _PDCLIB_bigint10( &big, 9 );
    _PDCLIB_bigint32( &expected, UINT32_C( 1000000000 ) );
    TESTCASE( _PDCLIB_bigint_cmp( &big, &expected ) == 0 );

    _PDCLIB_bigint10( &big, 17 );
    _PDCLIB_bigint64( &expected, UINT32_C( 0x01634578 ), UINT32_C( 0x5d8a0000 ) );
    TESTCASE( _PDCLIB_bigint_cmp( &big, &expected ) == 0 );

    _PDCLIB_bigint10( &big, 18 );
    _PDCLIB_bigint64( &expected, UINT32_C( 0x0de0b6b3 ), UINT32_C( 0xa7640000 ) );
    TESTCASE( _PDCLIB_bigint_cmp( &big, &expected ) == 0 );
#endif
    return TEST_RESULTS;
}